

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O2

lzma_ret lzma_index_stream_padding(lzma_index *i,lzma_vli stream_padding)

{
  index_tree_node *piVar1;
  lzma_vli lVar2;
  lzma_vli lVar3;
  
  if ((stream_padding & 0x8000000000000003) == 0 && i != (lzma_index *)0x0) {
    piVar1 = (i->streams).rightmost;
    lVar3 = piVar1[4].uncompressed_base;
    piVar1[4].uncompressed_base = 0;
    lVar2 = lzma_index_file_size(i);
    if (-1 < (long)(lVar2 + stream_padding)) {
      lVar3 = stream_padding;
    }
    piVar1[4].uncompressed_base = lVar3;
    return (lzma_ret)((long)(lVar2 + stream_padding) >> 0x3f) & LZMA_DATA_ERROR;
  }
  return LZMA_PROG_ERROR;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_index_stream_padding(lzma_index *i, lzma_vli stream_padding)
{
	index_stream *s;
	lzma_vli old_stream_padding;

	if (i == NULL || stream_padding > LZMA_VLI_MAX
			|| (stream_padding & 3) != 0)
		return LZMA_PROG_ERROR;

	s = (index_stream *)(i->streams.rightmost);

	// Check that the new value won't make the file grow too big.
	old_stream_padding = s->stream_padding;
	s->stream_padding = 0;
	if (lzma_index_file_size(i) + stream_padding > LZMA_VLI_MAX) {
		s->stream_padding = old_stream_padding;
		return LZMA_DATA_ERROR;
	}

	s->stream_padding = stream_padding;
	return LZMA_OK;
}